

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementCP
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot instance,RegSlot regSlot,
          CacheId inlineCacheIndex)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  PropertyId propertyId;
  int iVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *this_00;
  SymOpnd *this_01;
  undefined4 extraout_var;
  AddrOpnd *this_02;
  undefined4 extraout_var_00;
  JITTimeProfileInfo *this_03;
  TSize *pTVar6;
  ProfiledInstr *pPVar7;
  PropertySymOpnd *pPVar8;
  RegOpnd *dstOpnd;
  JitProfilingInstr *this_04;
  PropertySym *propertySym;
  IRBuilder *this_05;
  bool reuseTemp;
  BuiltinFunction local_34;
  bool local_33;
  OpCode local_32 [3];
  BuiltinFunction builtInIndex;
  bool isLdFldThatWasNotProfiled;
  OpCode newOpcode_local;
  
  local_32[0] = newOpcode;
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1233,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) goto LAB_00497396;
    *puVar5 = 0;
  }
  bVar2 = OpCodeAttr::IsProfiledOp(newOpcode);
  if (bVar2) {
    Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(local_32);
  }
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId = JITTimeFunctionBody::GetPropertyIdFromCacheId(this_00,inlineCacheIndex);
  reuseTemp = false;
  this_01 = BuildFieldOpnd(this,local_32[0],instance,propertyId,0xffffffff,PropertyKindData,
                           inlineCacheIndex);
  local_33 = false;
  bVar3 = false;
  switch(local_32[0]) {
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
  case InitRootFld:
    break;
  case ArgIn0:
  case ArgOut_A:
  case ProfiledArgOut_A:
  case ArgOut_ANonVar:
  case ArgOut_Env:
  case Delete_A:
  case ProfiledLdFld:
  case ProfiledLdFld_ReuseLoc:
  case LdLocalFld:
  case ProfiledLdLocalFld:
  case LdLocalFld_ReuseLoc:
  case ProfiledLdLocalFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
  case ProfiledLdRootMethodFld:
  case ProfiledStFld:
  case ProfiledStRootFld:
  case StLocalFld:
  case ProfiledStLocalFld:
  case ProfiledStFldStrict:
  case ProfiledStRootFldStrict:
  case ProfiledInitFld:
  case InitLocalFld:
  case ProfiledInitLocalFld:
switchD_0049709a_caseD_58:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x12b1,"((0))","Unknown ElementCP opcode");
    if (bVar2) {
      *puVar5 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
LAB_00497396:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  case LdFld_ReuseLoc:
    local_32[0] = LdFld;
    bVar3 = true;
  case LdFld:
  case LdFldForTypeOf:
switchD_0049709a_caseD_5e:
    reuseTemp = bVar3;
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (((bVar3) &&
        (pPVar8 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd),
        pPVar8->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar8->m_polyCacheUtil)) {
      pPVar8->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
    goto switchD_0049709a_caseD_68;
  case StFld:
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_01);
    if (((bVar3) &&
        (pPVar8 = IR::Opnd::AsPropertySymOpnd(&this_01->super_Opnd),
        pPVar8->m_runtimePolymorphicInlineCache != (JITTimePolymorphicInlineCache *)0x0)) &&
       (-1 < (char)pPVar8->m_polyCacheUtil)) {
      pPVar8->m_runtimePolymorphicInlineCache = (JITTimePolymorphicInlineCache *)0x0;
    }
    break;
  default:
    if (local_32[0] != InitUndeclLetFld) {
      if (local_32[0] != ScopedLdMethodFld) {
        bVar3 = false;
        if (local_32[0] == LdLen_A) goto switchD_0049709a_caseD_5e;
        if (local_32[0] == InitUndeclConstFld) break;
        if (local_32[0] != LdRootFldForTypeOf) goto switchD_0049709a_caseD_58;
      }
      goto switchD_0049709a_caseD_68;
    }
  }
  if (local_32[0] == InitUndeclConstFld) {
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[4])();
    this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var_00,iVar4),AddrOpndKindDynamicVar,this->m_func,
                                true,(Var)0x0);
    IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x2000);
    local_32[0] = InitConstFld;
  }
  else if (local_32[0] == InitUndeclLetFld) {
    iVar4 = (*this->m_func->m_scriptContextInfo->_vptr_ScriptContextInfo[4])();
    this_02 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar4),AddrOpndKindDynamicVar,this->m_func,
                                true,(Var)0x0);
    IR::Opnd::SetValueType(&this_02->super_Opnd,(ValueType)0x2000);
    local_32[0] = InitLetFld;
  }
  else {
    this_02 = (AddrOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
  }
  if (bVar2) {
    bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
    if (bVar2) {
      this_04 = IR::JitProfilingInstr::New
                          (local_32[0],&this_01->super_Opnd,&this_02->super_Opnd,this->m_func);
    }
    else {
      bVar2 = Func::HasProfileInfo(this->m_func);
      if (!bVar2) goto LAB_0049724d;
      this_04 = (JitProfilingInstr *)
                IR::ProfiledInstr::New
                          (local_32[0],&this_01->super_Opnd,&this_02->super_Opnd,this->m_func);
      this_03 = Func::GetReadOnlyProfileInfo(this->m_func);
      pTVar6 = (TSize *)JITTimeProfileInfo::GetFldInfo(this_03,inlineCacheIndex);
      pPVar7 = IR::Instr::AsProfiledInstr((Instr *)this_04);
      (pPVar7->u).field_3.fldInfoData = *pTVar6;
    }
    if (this_04 != (JitProfilingInstr *)0x0) goto LAB_0049735c;
  }
LAB_0049724d:
  this_04 = (JitProfilingInstr *)
            IR::Instr::New(local_32[0],&this_01->super_Opnd,&this_02->super_Opnd,this->m_func);
LAB_0049735c:
  AddInstr(this,&this_04->super_Instr,offset);
  if ((local_33 == true) && (bVar2 = DoBailOnNoProfile(this), bVar2)) {
    InsertBailOnNoProfile(this,&this_04->super_Instr);
  }
  return;
switchD_0049709a_caseD_68:
  dstOpnd = BuildDstOpnd(this,regSlot,TyVar,false,reuseTemp);
  if ((!bVar2) ||
     (this_04 = (JitProfilingInstr *)
                BuildProfiledFieldLoad(this,local_32[0],dstOpnd,this_01,inlineCacheIndex,&local_33),
     this_04 == (JitProfilingInstr *)0x0)) {
    this_04 = (JitProfilingInstr *)
              IR::Instr::New(local_32[0],&dstOpnd->super_Opnd,&this_01->super_Opnd,this->m_func);
  }
  if ((local_32[0] - 0x5e < 0x28) &&
     ((0x8000014401U >> ((ulong)(local_32[0] - 0x5e) & 0x3f) & 1) != 0)) {
    local_34._value = 'H';
    this_05 = (IRBuilder *)this_01->m_sym;
    propertySym = Sym::AsPropertySym((Sym *)this_05);
    CheckBuiltIn(this_05,propertySym,&local_34);
    (dstOpnd->m_sym->m_builtInIndex)._value = local_34._value;
  }
  goto LAB_0049735c;
}

Assistant:

void
IRBuilder::BuildElementCP(Js::OpCode newOpcode, uint32 offset, Js::RegSlot instance, Js::RegSlot regSlot, Js::CacheId inlineCacheIndex)
{
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));

    Js::PropertyId  propertyId;
    bool isProfiled = OpCodeAttr::IsProfiledOp(newOpcode);

    if (isProfiled)
    {
        Js::OpCodeUtil::ConvertNonCallOpToNonProfiled(newOpcode);
    }

    propertyId = m_func->GetJITFunctionBody()->GetPropertyIdFromCacheId(inlineCacheIndex);

    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, instance, propertyId, (Js::PropertyIdIndexType)-1, PropertyKindData, inlineCacheIndex);
    IR::RegOpnd *   regOpnd;

    IR::Instr *     instr = nullptr;
    bool isLdFldThatWasNotProfiled = false;
    bool reuseLoc = false;
    switch (newOpcode)
    {
    case Js::OpCode::LdFld_ReuseLoc:
        reuseLoc = true;
        newOpcode = Js::OpCode::LdFld;
        // fall through
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdLen_A:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::LdFldForCallApplyTarget:
    case Js::OpCode::LdRootFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
        // Load
        // LdMethodFromFlags is backend only. Don't need to be added here.
        regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);

        if (isProfiled)
        {
            instr = this->BuildProfiledFieldLoad(newOpcode, regOpnd, fieldSymOpnd, inlineCacheIndex, &isLdFldThatWasNotProfiled);
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        }

        if (newOpcode == Js::OpCode::LdFld ||
            newOpcode == Js::OpCode::LdFldForCallApplyTarget ||
            newOpcode == Js::OpCode::LdMethodFld ||
            newOpcode == Js::OpCode::LdRootMethodFld ||
            newOpcode == Js::OpCode::ScopedLdMethodFld)
        {
            // Check whether we're loading (what appears to be) a built-in method.
            Js::BuiltinFunction builtInIndex = Js::BuiltinFunction::None;
            PropertySym *fieldSym = fieldSymOpnd->m_sym->AsPropertySym();
            this->CheckBuiltIn(fieldSym, &builtInIndex);
            regOpnd->m_sym->m_builtInIndex = builtInIndex;
        }
        break;

    case Js::OpCode::StFld:
        if (fieldSymOpnd->IsPropertySymOpnd())
        {
            fieldSymOpnd->AsPropertySymOpnd()->TryDisableRuntimePolymorphicCache();
        }
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::InitLetFld:
    case Js::OpCode::InitRootLetFld:
    case Js::OpCode::InitConstFld:
    case Js::OpCode::InitRootConstFld:
    case Js::OpCode::InitUndeclLetFld:
    case Js::OpCode::InitUndeclConstFld:
    case Js::OpCode::InitClassMember:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    {
        IR::Opnd *srcOpnd;
        // Store
        if (newOpcode == Js::OpCode::InitUndeclLetFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitLetFld;
        }
        else if (newOpcode == Js::OpCode::InitUndeclConstFld)
        {
            srcOpnd = IR::AddrOpnd::New(m_func->GetScriptContextInfo()->GetUndeclBlockVarAddr(), IR::AddrOpndKindDynamicVar, this->m_func, true);
            srcOpnd->SetValueType(ValueType::PrimitiveOrObject);
            newOpcode = Js::OpCode::InitConstFld;
        }
        else
        {
            srcOpnd = this->BuildSrcOpnd(regSlot);
        }

        if (isProfiled)
        {
            if (m_func->DoSimpleJitDynamicProfile())
            {
                instr = IR::JitProfilingInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
            }
            else if (this->m_func->HasProfileInfo())
            {

                instr = IR::ProfiledInstr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
                instr->AsProfiledInstr()->u.FldInfo() = *(m_func->GetReadOnlyProfileInfo()->GetFldInfo(inlineCacheIndex));
            }
        }

        // If it hasn't been set yet
        if (!instr)
        {
            instr = IR::Instr::New(newOpcode, fieldSymOpnd, srcOpnd, m_func);
        }
        break;
    }

    default:
        AssertMsg(UNREACHED, "Unknown ElementCP opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);

    if(isLdFldThatWasNotProfiled && DoBailOnNoProfile())
    {
        InsertBailOnNoProfile(instr);
    }
}